

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobotDynamics.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
RobotDynamics::getTau
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,RobotDynamics *this,
          double G,vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                   *R,
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *P,vector<double,_std::allocator<double>_> *theta_d,
          vector<double,_std::allocator<double>_> *theta_dd)

{
  allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *paVar1;
  allocator<double> *this_00;
  double dVar2;
  double dVar3;
  uint uVar4;
  size_type sVar5;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pDVar6;
  reference this_01;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pMVar7;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMVar8;
  reference pvVar9;
  Matrix<double,3,1,0,3,1> *pMVar10;
  MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *pMVar11;
  MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *pMVar12;
  StorageBaseType *matrix;
  MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *pMVar13;
  Scalar SVar14;
  Product<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  PVar15;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> PVar16;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  PVar17;
  non_const_type local_6e8;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_6e0;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_6d0;
  type local_6c0;
  type local_6a8;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_690;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  local_680;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_660;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_628;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_5d8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_5c8;
  uint local_5a4;
  Scalar SStack_5a0;
  int i_3;
  Scalar local_598;
  Scalar local_590;
  Matrix<double,_3,_1,_0,_3,_1> local_588;
  undefined1 local_570 [8];
  Matrix3d identity_mat;
  type local_518;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_500;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_4f0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_4d0;
  type local_4a8;
  type local_490;
  type local_478;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_460;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_448;
  type local_418;
  type local_400;
  type local_3e8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_3d0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_3b8;
  XprTypeNested local_388;
  Product<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
  local_380;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_348;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_320;
  XprTypeNested local_2f8;
  Product<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_2f0;
  type local_2e0;
  XprTypeNested local_2c8;
  Product<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_2c0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_2b0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_290;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_238;
  XprTypeNested local_210;
  Product<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_208;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_1f8;
  uint local_1b4;
  Scalar SStack_1b0;
  int i_2;
  Scalar local_1a8;
  Matrix<double,_3,_1,_0,_3,_1> local_1a0;
  Scalar local_188;
  Scalar local_180;
  Scalar local_178;
  undefined1 local_170 [8];
  Vector3d Z;
  uint local_150;
  int i_1;
  int i;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  n;
  undefined1 local_128 [8];
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  f;
  undefined1 local_108 [8];
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  N;
  undefined1 local_e8 [8];
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  F;
  undefined1 local_c8 [8];
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  vC_d;
  undefined1 local_a8 [8];
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  v_d;
  undefined1 local_88 [8];
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  w_d;
  allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_59;
  undefined1 local_58 [8];
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  w;
  vector<double,_std::allocator<double>_> *theta_dd_local;
  vector<double,_std::allocator<double>_> *theta_d_local;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *P_local;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *R_local;
  double G_local;
  RobotDynamics *this_local;
  vector<double,_std::allocator<double>_> *tau;
  
  uVar4 = this->JOINT_NUM;
  w.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)theta_dd;
  R_local = (vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             *)G;
  G_local = (double)this;
  this_local = (RobotDynamics *)__return_storage_ptr__;
  sVar5 = std::
          vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
          ::size(R);
  if (uVar4 != sVar5) {
    __assert_fail("JOINT_NUM == R.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/notlixiang[P]Robot-Arm-Dynamics-Library/RobotDynamics.cpp"
                  ,0x1a,
                  "vector<double> RobotDynamics::getTau(double, vector<Eigen::Matrix3d>, vector<Eigen::Vector3d>, vector<double>, vector<double>)"
                 );
  }
  uVar4 = this->JOINT_NUM;
  sVar5 = std::
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::size(P);
  if (uVar4 != sVar5) {
    __assert_fail("JOINT_NUM == P.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/notlixiang[P]Robot-Arm-Dynamics-Library/RobotDynamics.cpp"
                  ,0x1b,
                  "vector<double> RobotDynamics::getTau(double, vector<Eigen::Matrix3d>, vector<Eigen::Vector3d>, vector<double>, vector<double>)"
                 );
  }
  uVar4 = this->JOINT_NUM;
  sVar5 = std::vector<double,_std::allocator<double>_>::size(theta_d);
  if (uVar4 != sVar5) {
    __assert_fail("JOINT_NUM == theta_d.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/notlixiang[P]Robot-Arm-Dynamics-Library/RobotDynamics.cpp"
                  ,0x1c,
                  "vector<double> RobotDynamics::getTau(double, vector<Eigen::Matrix3d>, vector<Eigen::Vector3d>, vector<double>, vector<double>)"
                 );
  }
  uVar4 = this->JOINT_NUM;
  sVar5 = std::vector<double,_std::allocator<double>_>::size(theta_dd);
  if (uVar4 != sVar5) {
    __assert_fail("JOINT_NUM == theta_dd.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/notlixiang[P]Robot-Arm-Dynamics-Library/RobotDynamics.cpp"
                  ,0x1d,
                  "vector<double> RobotDynamics::getTau(double, vector<Eigen::Matrix3d>, vector<Eigen::Vector3d>, vector<double>, vector<double>)"
                 );
  }
  uVar4 = this->JOINT_NUM;
  std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::allocator(&local_59);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)local_58,(ulong)(uVar4 + 1),&local_59);
  std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~allocator(&local_59);
  uVar4 = this->JOINT_NUM;
  paVar1 = (allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           ((long)&v_d.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::allocator(paVar1);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)local_88,(ulong)(uVar4 + 1),paVar1);
  std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~allocator
            ((allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             ((long)&v_d.
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  uVar4 = this->JOINT_NUM;
  paVar1 = (allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           ((long)&vC_d.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::allocator(paVar1);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)local_a8,(ulong)(uVar4 + 1),paVar1);
  std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~allocator
            ((allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             ((long)&vC_d.
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  uVar4 = this->JOINT_NUM;
  paVar1 = (allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           ((long)&F.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::allocator(paVar1);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)local_c8,(ulong)(uVar4 + 1),paVar1);
  std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~allocator
            ((allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             ((long)&F.
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  uVar4 = this->JOINT_NUM;
  paVar1 = (allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           ((long)&N.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::allocator(paVar1);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)local_e8,(ulong)(uVar4 + 1),paVar1);
  std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~allocator
            ((allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             ((long)&N.
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  uVar4 = this->JOINT_NUM;
  paVar1 = (allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           ((long)&f.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::allocator(paVar1);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)local_108,(ulong)(uVar4 + 1),paVar1);
  std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~allocator
            ((allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             ((long)&f.
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  uVar4 = this->JOINT_NUM;
  paVar1 = (allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           ((long)&n.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::allocator(paVar1);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)local_128,(ulong)(uVar4 + 2),paVar1);
  std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~allocator
            ((allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             ((long)&n.
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  uVar4 = this->JOINT_NUM;
  std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::allocator
            ((allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)((long)&i_1 + 3));
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)&i,(ulong)(uVar4 + 2),
           (allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)((long)&i_1 + 3));
  std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~allocator
            ((allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)((long)&i_1 + 3));
  for (local_150 = 0; local_150 < this->JOINT_NUM + 1; local_150 = local_150 + 1) {
    pDVar6 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)local_58,(long)(int)local_150);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero(pDVar6);
    pDVar6 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)local_88,(long)(int)local_150);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero(pDVar6);
    pDVar6 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)local_a8,(long)(int)local_150);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero(pDVar6);
    pDVar6 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)local_c8,(long)(int)local_150);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero(pDVar6);
    pDVar6 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)local_e8,(long)(int)local_150);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero(pDVar6);
    pDVar6 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)local_108,(long)(int)local_150);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero(pDVar6);
  }
  for (Z.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2].
       _4_4_ = 0;
      Z.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]._4_4_
      < this->JOINT_NUM + 2;
      Z.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]._4_4_
           = Z.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [2]._4_4_ + 1) {
    pDVar6 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)local_128,
                          (long)(int)Z.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                     m_storage.m_data.array[2]._4_4_);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero(pDVar6);
    pDVar6 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)&i,(long)(int)Z.
                                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                           .m_storage.m_data.array[2]._4_4_);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero(pDVar6);
  }
  Z.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]._3_1_ = 0
  ;
  uVar4 = this->JOINT_NUM;
  this_00 = (allocator<double> *)
            ((long)Z.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array + 0x12);
  std::allocator<double>::allocator(this_00);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,(ulong)uVar4,this_00);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)Z.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                    array + 0x12));
  local_178 = 0.0;
  local_180 = 0.0;
  local_188 = 1.0;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)local_170,&local_178,&local_180,&local_188);
  local_1a8 = 0.0;
  SStack_1b0 = 0.0;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (&local_1a0,&local_1a8,&stack0xfffffffffffffe50,(Scalar *)&R_local);
  this_01 = std::
            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          *)local_a8,0);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=(this_01,&local_1a0);
  for (local_1b4 = 0; local_1b4 < this->JOINT_NUM; local_1b4 = local_1b4 + 1) {
    pMVar7 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             ::operator[](R,(long)(int)local_1b4);
    local_210 = (XprTypeNested)
                Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::inverse(pMVar7);
    pMVar8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)local_58,(long)(int)local_1b4);
    PVar15 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
                       ((MatrixBase<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>> *)&local_210,
                        pMVar8);
    local_208 = PVar15;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](theta_d,(long)(int)local_1b4);
    Eigen::operator*(&local_238,pvVar9,(StorageBaseType *)local_170);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>>
    ::operator+(&local_1f8,
                (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                 *)&local_208,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)&local_238);
    pMVar10 = (Matrix<double,3,1,0,3,1> *)
              std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)local_58,(long)(int)(local_1b4 + 1));
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (pMVar10,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                        *)&local_1f8);
    pMVar7 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             ::operator[](R,(long)(int)local_1b4);
    local_2c8 = (XprTypeNested)
                Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::inverse(pMVar7);
    pMVar8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)local_88,(long)(int)local_1b4);
    PVar15 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
                       ((MatrixBase<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>> *)&local_2c8,
                        pMVar8);
    local_2c0 = PVar15;
    pMVar7 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             ::operator[](R,(long)(int)local_1b4);
    local_2f8 = (XprTypeNested)
                Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::inverse(pMVar7);
    pMVar8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)local_58,(long)(int)local_1b4);
    PVar15 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
                       ((MatrixBase<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>> *)&local_2f8,
                        pMVar8);
    local_2f0 = PVar15;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](theta_d,(long)(int)local_1b4);
    Eigen::operator*(&local_320,pvVar9,(StorageBaseType *)local_170);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>>
    ::
    cross<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              (&local_2e0,
               (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                *)&local_2f0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_320);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>>
    ::operator+(&local_2b0,
                (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                 *)&local_2c0,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_2e0);
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](theta_dd,(long)(int)local_1b4)
    ;
    Eigen::operator*(&local_348,pvVar9,(StorageBaseType *)local_170);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
    ::operator+(&local_290,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                 *)&local_2b0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)&local_348);
    pMVar10 = (Matrix<double,3,1,0,3,1> *)
              std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)local_88,(long)(int)(local_1b4 + 1));
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (pMVar10,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                        *)&local_290);
    pMVar7 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             ::operator[](R,(long)(int)local_1b4);
    local_388 = (XprTypeNested)
                Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::inverse(pMVar7);
    pMVar11 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
              std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)local_88,(long)(int)local_1b4);
    pMVar8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[](P,(long)(int)local_1b4);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (&local_3e8,pMVar11,pMVar8);
    pMVar11 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
              std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)local_58,(long)(int)local_1b4);
    pMVar12 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
              std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)local_58,(long)(int)local_1b4);
    pMVar8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[](P,(long)(int)local_1b4);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (&local_418,pMVar12,pMVar8);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (&local_400,pMVar11,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_418);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
              (&local_3d0,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_3e8,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_400);
    pMVar8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)local_a8,(long)(int)local_1b4);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
    ::operator+(&local_3b8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                 *)&local_3d0,pMVar8);
    Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
              (&local_380,(MatrixBase<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>> *)&local_388,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_3b8);
    pMVar10 = (Matrix<double,3,1,0,3,1> *)
              std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)local_a8,(long)(int)(local_1b4 + 1));
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (pMVar10,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                        *)&local_380);
    pMVar11 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
              std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)local_88,(long)(int)(local_1b4 + 1));
    pMVar8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[](&this->PC,(long)(int)local_1b4);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (&local_478,pMVar11,pMVar8);
    pMVar11 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
              std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)local_58,(long)(int)(local_1b4 + 1));
    pMVar12 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
              std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)local_58,(long)(int)(local_1b4 + 1));
    pMVar8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[](&this->PC,(long)(int)local_1b4);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (&local_4a8,pMVar12,pMVar8);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (&local_490,pMVar11,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_4a8);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
              (&local_460,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_478,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_490);
    pMVar8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)local_a8,(long)(int)(local_1b4 + 1));
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
    ::operator+(&local_448,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                 *)&local_460,pMVar8);
    pMVar10 = (Matrix<double,3,1,0,3,1> *)
              std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)local_c8,(long)(int)(local_1b4 + 1));
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (pMVar10,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)&local_448);
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&this->m,(long)(int)local_1b4)
    ;
    matrix = (StorageBaseType *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)local_c8,(long)(int)(local_1b4 + 1));
    Eigen::operator*(&local_4d0,pvVar9,matrix);
    pMVar10 = (Matrix<double,3,1,0,3,1> *)
              std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)local_e8,(long)(int)(local_1b4 + 1));
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (pMVar10,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)&local_4d0);
    pMVar13 = (MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
              std::
              vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ::operator[](&this->I,(long)(int)local_1b4);
    pMVar8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)local_88,(long)(int)(local_1b4 + 1));
    PVar16 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*(pMVar13,pMVar8);
    local_500 = PVar16;
    pMVar11 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
              std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)local_58,(long)(int)(local_1b4 + 1));
    pMVar13 = (MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
              std::
              vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ::operator[](&this->I,(long)(int)local_1b4);
    pMVar8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)local_58,(long)(int)(local_1b4 + 1));
    PVar16 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*(pMVar13,pMVar8);
    identity_mat.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [8] = (double)PVar16.m_lhs;
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
    cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              (&local_518,pMVar11,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)(identity_mat.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array + 8));
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>::
    operator+(&local_4f0,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
               *)&local_500,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_518);
    pMVar10 = (Matrix<double,3,1,0,3,1> *)
              std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)local_108,(long)(int)(local_1b4 + 1));
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (pMVar10,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)&local_4f0);
  }
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)local_570);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_570);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::push_back(R,(value_type *)local_570);
  local_590 = 0.0;
  local_598 = 0.0;
  SStack_5a0 = 0.0;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (&local_588,&local_590,&local_598,&stack0xfffffffffffffa60);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::push_back(P,&local_588);
  for (local_5a4 = this->JOINT_NUM; 0 < (int)local_5a4; local_5a4 = local_5a4 - 1) {
    pMVar13 = (MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
              std::
              vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ::operator[](R,(long)(int)local_5a4);
    pMVar8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)local_128,(long)(int)(local_5a4 + 1));
    PVar16 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*(pMVar13,pMVar8);
    local_5d8 = PVar16;
    pMVar8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)local_e8,(long)(int)local_5a4);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>::
    operator+(&local_5c8,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
               *)&local_5d8,pMVar8);
    pMVar10 = (Matrix<double,3,1,0,3,1> *)
              std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)local_128,(long)(int)local_5a4);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (pMVar10,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)&local_5c8);
    pMVar11 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
              std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)local_108,(long)(int)local_5a4);
    pMVar13 = (MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
              std::
              vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ::operator[](R,(long)(int)local_5a4);
    pMVar8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)&i,(long)(int)(local_5a4 + 1));
    PVar16 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*(pMVar13,pMVar8);
    local_690 = PVar16;
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
              (&local_680,pMVar11,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&local_690);
    pMVar11 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
              std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::operator[](&this->PC,(long)(int)(local_5a4 - 1));
    pMVar8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)local_e8,(long)(int)local_5a4);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (&local_6a8,pMVar11,pMVar8);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
    ::operator+(&local_660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                 *)&local_680,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_6a8);
    pMVar11 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
              std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::operator[](P,(long)(int)local_5a4);
    pMVar13 = (MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
              std::
              vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ::operator[](R,(long)(int)local_5a4);
    pMVar8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)local_128,(long)(int)(local_5a4 + 1));
    PVar16 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*(pMVar13,pMVar8);
    local_6d0 = PVar16;
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
    cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              (&local_6c0,pMVar11,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&local_6d0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
    ::operator+(&local_628,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                 *)&local_660,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_6c0);
    pMVar10 = (Matrix<double,3,1,0,3,1> *)
              std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)&i,(long)(int)local_5a4);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (pMVar10,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)&local_628);
    pDVar6 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)&i,(long)(int)local_5a4);
    local_6e8 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose(pDVar6);
    PVar17 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>::operator*
                       ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>> *)&local_6e8,
                        (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_170);
    local_6e0 = PVar17;
    SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                       ((dense_product_base *)&local_6e0);
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->damping,(long)(int)(local_5a4 - 1));
    dVar2 = *pvVar9;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       (theta_d,(long)(int)(local_5a4 - 1));
    dVar3 = *pvVar9;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       (__return_storage_ptr__,(long)(int)(local_5a4 - 1));
    *pvVar9 = dVar2 * dVar3 + SVar14;
  }
  Z.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]._3_1_ = 1
  ;
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)&i);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)local_128);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)local_108);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)local_e8);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)local_c8);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)local_a8);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)local_88);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)local_58);
  return __return_storage_ptr__;
}

Assistant:

vector<double> RobotDynamics::
getTau(double G, vector<Eigen::Matrix3d> R, vector<Eigen::Vector3d> P,
       vector<double> theta_d, vector<double> theta_dd)
{
    assert(JOINT_NUM == R.size());
    assert(JOINT_NUM == P.size());
    assert(JOINT_NUM == theta_d.size());
    assert(JOINT_NUM == theta_dd.size());

    vector<Eigen::Vector3d> w(JOINT_NUM + 1);
    vector<Eigen::Vector3d> w_d(JOINT_NUM + 1);
    vector<Eigen::Vector3d> v_d(JOINT_NUM + 1);
    vector<Eigen::Vector3d> vC_d(JOINT_NUM + 1);
    vector<Eigen::Vector3d> F(JOINT_NUM + 1);
    vector<Eigen::Vector3d> N(JOINT_NUM + 1);
    vector<Eigen::Vector3d> f(JOINT_NUM + 2);
    vector<Eigen::Vector3d> n(JOINT_NUM + 2);
    for (int i = 0; i < JOINT_NUM + 1; i++)
    {
        w[i].setZero();
        w_d[i].setZero();
        v_d[i].setZero();
        vC_d[i].setZero();
        F[i].setZero();
        N[i].setZero();
    }
    for (int i = 0; i < JOINT_NUM + 2; i++)
    {
        f[i].setZero();
        n[i].setZero();
    }
    vector<double> tau(JOINT_NUM);
    Eigen::Vector3d Z(0, 0, 1);
    v_d[0] = Eigen::Vector3d(0, 0, G);
    for (int i = 0; i < JOINT_NUM; i++)
    {
        w[i + 1] = R[i].inverse() * w[i] + theta_d[i] * Z;
        w_d[i + 1] = R[i].inverse() * w_d[i] + (R[i].inverse() * w[i]).cross(theta_d[i] * Z) + theta_dd[i] * Z;
        v_d[i + 1] = R[i].inverse() * (w_d[i].cross(P[i]) + w[i].cross(w[i].cross(P[i])) + v_d[i]);
        vC_d[i + 1] = w_d[i + 1].cross(PC[i]) + w[i + 1].cross(w[i + 1].cross(PC[i])) + v_d[i + 1];
        F[i + 1] = m[i] * vC_d[i + 1];
        N[i + 1] = I[i] * w_d[i + 1] + w[i + 1].cross(I[i] * w[i + 1]);
    }
    Eigen::Matrix3d identity_mat;
    identity_mat.setIdentity();
    R.push_back(identity_mat);
    P.push_back(Eigen::Vector3d(0, 0, 0));
    for (int i = JOINT_NUM; i >= 1; i--)
    {
        f[i] = R[i] * f[i + 1] + F[i];
        n[i] = N[i] + R[i] * n[i + 1] + PC[i - 1].cross(F[i]) + P[i].cross(R[i] * f[i + 1]);
        tau[i - 1] = n[i].transpose() * Z + damping[i - 1] * theta_d[i - 1];
    }
    return tau;
}